

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O2

int GetUBXPacketublox(UBLOX *publox,UBXDATA *pUBXData)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int local_10a4;
  int packetlen;
  int mid;
  int mclass;
  int nbBytesDiscarded;
  uchar *ptr;
  UBXDATA *local_1088;
  CHRONO chrono;
  uchar recvbuf [4096];
  
  nbBytesDiscarded = 0;
  ptr = (uchar *)0x0;
  packetlen = 0;
  mclass = 0;
  mid = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x1000);
  local_10a4 = 8;
  iVar1 = ReadAllRS232Port(&publox->RS232Port,recvbuf,8);
  if (iVar1 == 0) {
    local_1088 = pUBXData;
    if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf,8,1,(FILE *)publox->pfSaveFile);
      fflush((FILE *)publox->pfSaveFile);
    }
    iVar1 = 8;
    do {
      iVar2 = FindPacketUBX(recvbuf,iVar1,&mclass,&mid,&packetlen,&local_10a4,&ptr,&nbBytesDiscarded
                           );
      if (iVar2 == 1) {
        local_10a4 = 8;
        if (nbBytesDiscarded < 8) {
          local_10a4 = nbBytesDiscarded;
        }
      }
      else if (iVar2 == 0) {
        if (0 < iVar1 - (nbBytesDiscarded + packetlen)) {
          puts("Warning getting data from a ublox : Unexpected data after a packet. ");
        }
        iVar1 = ProcessPacketUBX(ptr,packetlen,mclass,mid,local_1088);
        return (uint)(iVar1 != 0);
      }
      iVar2 = local_10a4;
      iVar1 = iVar1 - nbBytesDiscarded;
      memmove(recvbuf,recvbuf + nbBytesDiscarded,(long)iVar1);
      if (0xfff < iVar2 + iVar1) {
        puts("Error reading data from a ublox : Invalid data. ");
        return 4;
      }
      iVar2 = ReadAllRS232Port(&publox->RS232Port,recvbuf + iVar1,iVar2);
      if (iVar2 != 0) goto LAB_00115713;
      if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf + iVar1,(long)local_10a4,1,(FILE *)publox->pfSaveFile);
        fflush((FILE *)publox->pfSaveFile);
      }
      iVar1 = iVar1 + local_10a4;
      dVar3 = GetTimeElapsedChronoQuick(&chrono);
    } while (dVar3 <= 4.0);
    puts("Error reading data from a ublox : Packet timeout. ");
    iVar1 = 2;
  }
  else {
LAB_00115713:
    puts("Error reading data from a ublox. ");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int GetUBXPacketublox(UBLOX* publox, UBXDATA* pUBXData)
{
	unsigned char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	int packetlen = 0;
	int mclass = 0, mid = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_PACKET_LENGTH_UBX;
	if (ReadAllRS232Port(&publox->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindPacketUBX(recvbuf, BytesReceived, &mclass, &mid, &packetlen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_PACKET_LENGTH_UBX, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Packet timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-packetlen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a packet. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *ppacketlen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*ppacketlen > 0)
	//{
	//	memcpy(databuf, ptr, *ppacketlen);
	//}

	if (ProcessPacketUBX(ptr, packetlen, mclass, mid, pUBXData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}